

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Farm.cpp
# Opt level: O1

void __thiscall Farm::editTruck(Farm *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pTVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  Truck *truck;
  pointer this_00;
  string plate;
  double capacity;
  string local_98;
  undefined1 *local_78;
  size_t local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  double local_58;
  string local_50;
  
  local_78 = &local_68;
  local_70 = 0;
  local_68 = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter truck\'s plate: ",0x15);
  cVar3 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x48);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&local_78,cVar3);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_78,local_78 + local_70);
  bVar4 = searchTruckByPlate(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  if (bVar4) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"Enter truck\'s new capacity: ","");
    getDouble(&local_58,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    pTVar2 = (this->trucks).super__Vector_base<Truck,_std::allocator<Truck>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (this_00 = (this->trucks).super__Vector_base<Truck,_std::allocator<Truck>_>._M_impl.
                   super__Vector_impl_data._M_start; this_00 != pTVar2; this_00 = this_00 + 1) {
      while( true ) {
        Truck::getPlate_abi_cxx11_(&local_98,this_00);
        if (local_98._M_string_length == local_70) {
          if (local_98._M_string_length == 0) {
            bVar4 = true;
          }
          else {
            iVar5 = bcmp(local_98._M_dataplus._M_p,local_78,local_98._M_string_length);
            bVar4 = iVar5 == 0;
          }
        }
        else {
          bVar4 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar1) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if (!bVar4) break;
        Truck::setCapacity(this_00,local_58);
        this_00 = this_00 + 1;
        if (bVar4 || this_00 == pTVar2) goto LAB_001256e6;
      }
    }
LAB_001256e6:
    this->farmFileChanged = true;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Truck successfully edited!",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"ENTER to go back","");
    enterWait(&local_98);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"ERROR: It doesn\'t exist a truck with the given plate!","");
    cinERR(&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"ENTER to go back","");
    enterWait(&local_98);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  return;
}

Assistant:

void Farm::editTruck() {
    string plate;
    double capacity;

    cout << "Enter truck's plate: ";
    getline(cin, plate);
    if(!searchTruckByPlate(plate)){
        cinERR("ERROR: It doesn't exist a truck with the given plate!");
        enterWait();
        return;
    }

    getDouble(capacity, "Enter truck's new capacity: ");

    for(auto &truck : trucks){
        if(truck.getPlate() == plate){
            truck.setCapacity(capacity);
            break;
        }
    }

    farmFileChanged = true;
    cout << "Truck successfully edited!" << endl;
    enterWait();
}